

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clipper.cpp
# Opt level: O2

void __thiscall Clipper::DoRemoveClipRange(Clipper *this,angle_t start,angle_t end)

{
  uint uVar1;
  uint end_00;
  ClipNode *pCVar2;
  ClipNode *pCVar3;
  ClipNode **ppCVar4;
  
  if (this->cliphead != (ClipNode *)0x0) {
    ppCVar4 = &this->cliphead;
    pCVar3 = this->cliphead;
    while ((pCVar3 != (ClipNode *)0x0 && (pCVar3->start < end))) {
      if ((pCVar3->start < start) || (end < pCVar3->end)) {
        pCVar3 = pCVar3->next;
      }
      else {
        pCVar2 = pCVar3->next;
        RemoveRange(this,pCVar3);
        pCVar3 = pCVar2;
      }
    }
    while (pCVar3 = *ppCVar4, pCVar3 != (ClipNode *)0x0) {
      uVar1 = pCVar3->start;
      if (uVar1 <= end && start <= uVar1) {
        pCVar3->start = end;
        return;
      }
      end_00 = pCVar3->end;
      if (end < end_00 || end_00 < start) {
        if (uVar1 < start && end < end_00) {
          pCVar2 = ClipNode::NewRange(end,end_00);
          pCVar3->end = start;
          pCVar2->next = pCVar3->next;
          pCVar2->prev = pCVar3;
          pCVar3->next = pCVar2;
          if (pCVar2->next == (ClipNode *)0x0) {
            return;
          }
          pCVar2->next->prev = pCVar2;
          return;
        }
      }
      else {
        pCVar3->end = start;
      }
      ppCVar4 = &pCVar3->next;
    }
  }
  return;
}

Assistant:

void Clipper::DoRemoveClipRange(angle_t start, angle_t end)
{
	ClipNode *node, *temp;

	if (cliphead)
	{
		//check to see if range contains any old ranges
		node = cliphead;
		while (node != NULL && node->start < end)
		{
			if (node->start >= start && node->end <= end)
			{
				temp = node;
				node = node->next;
				RemoveRange(temp);
			}
			else
			{
				node = node->next;
			}
		}
		
		//check to see if range overlaps a range (or possibly 2)
		node = cliphead;
		while (node != NULL)
		{
			if (node->start >= start && node->start <= end)
			{
				node->start = end;
				break;
			}
			else if (node->end >= start && node->end <= end)
			{
				node->end=start;
			}
			else if (node->start < start && node->end > end)
			{
				temp=ClipNode::NewRange(end, node->end);
				node->end=start;
				temp->next=node->next;
				temp->prev=node;
				node->next=temp;
				if (temp->next) temp->next->prev=temp;
				break;
			}
			node = node->next;
		}
	}
}